

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscClass.c
# Opt level: O2

int Ssc_GiaSimIsConst0(Gia_Man_t *p,int iObj0)

{
  word *pwVar1;
  word *pwVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar4 = p->vSimsPi->nSize / (p->vCis->nSize - p->nRegs);
  pwVar2 = Gia_ObjSim(p,iObj0);
  uVar3 = 0;
  if (0 < (int)uVar4) {
    uVar3 = (ulong)uVar4;
  }
  if ((*pwVar2 & 1) == 0) {
    uVar5 = 0;
    do {
      if (uVar3 == uVar5) {
        return 1;
      }
      pwVar1 = pwVar2 + uVar5;
      uVar5 = uVar5 + 1;
    } while (*pwVar1 == 0);
  }
  else {
    uVar5 = 0;
    do {
      if (uVar3 == uVar5) {
        return 1;
      }
      pwVar1 = pwVar2 + uVar5;
      uVar5 = uVar5 + 1;
    } while (*pwVar1 == 0xffffffffffffffff);
  }
  return 0;
}

Assistant:

static inline int Ssc_GiaSimIsConst0( Gia_Man_t * p, int iObj0 )
{
    int w, nWords = Gia_ObjSimWords(p);
    word * pSim = Gia_ObjSim( p, iObj0 );
    if ( pSim[0] & 1 )
    {
        for ( w = 0; w < nWords; w++ )
            if ( ~pSim[w] )
                return 0;
    }
    else
    {
        for ( w = 0; w < nWords; w++ )
            if ( pSim[w] )
                return 0;
    }
    return 1;
}